

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionParser.cxx
# Opt level: O0

void __thiscall
cmGeneratorExpressionParser::ParseContent
          (cmGeneratorExpressionParser *this,cmGeneratorExpressionEvaluatorVector *result)

{
  uint uVar1;
  cmGeneratorExpressionEvaluatorVector *this_00;
  bool bVar2;
  bool bVar3;
  int iVar4;
  pointer pcVar5;
  reference puVar6;
  pointer pcVar7;
  TextContent *this_01;
  __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
  local_88;
  cmGeneratorExpressionToken *local_80;
  __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
  local_78;
  __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
  local_70 [3];
  unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>
  local_58;
  unique_ptr<TextContent,_std::default_delete<TextContent>_> local_50;
  __single_object n;
  __normal_iterator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_*,_std::vector<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>_>
  local_40;
  __normal_iterator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_*,_std::vector<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>_>
  local_38;
  __normal_iterator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_*,_std::vector<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>_>
  local_30;
  __normal_iterator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_*,_std::vector<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>_>
  local_28;
  __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
  local_20;
  cmGeneratorExpressionEvaluatorVector *local_18;
  cmGeneratorExpressionEvaluatorVector *result_local;
  cmGeneratorExpressionParser *this_local;
  
  local_18 = result;
  result_local = (cmGeneratorExpressionEvaluatorVector *)this;
  local_20._M_current =
       (cmGeneratorExpressionToken *)
       std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>::end
                 (&this->Tokens);
  bVar2 = __gnu_cxx::operator!=(&this->it,&local_20);
  if (!bVar2) {
    __assert_fail("this->it != this->Tokens.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmGeneratorExpressionParser.cxx"
                  ,0xce,
                  "void cmGeneratorExpressionParser::ParseContent(cmGeneratorExpressionEvaluatorVector &)"
                 );
  }
  pcVar5 = __gnu_cxx::
           __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
           ::operator->(&this->it);
  uVar1 = pcVar5->TokenType;
  if (uVar1 == 0) {
    if (this->NestingLevel == 0) {
      bVar3 = std::
              vector<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>
              ::empty(local_18);
      bVar2 = false;
      if (!bVar3) {
        local_30._M_current =
             (unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>
              *)std::
                vector<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>
                ::end(local_18);
        local_28 = __gnu_cxx::
                   __normal_iterator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_*,_std::vector<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>_>
                   ::operator-(&local_30,1);
        puVar6 = __gnu_cxx::
                 __normal_iterator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_*,_std::vector<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>_>
                 ::operator*(&local_28);
        pcVar7 = std::
                 unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>
                 ::operator->(puVar6);
        iVar4 = (*pcVar7->_vptr_cmGeneratorExpressionEvaluator[2])();
        bVar2 = iVar4 == 0;
      }
      if (bVar2) {
        local_40._M_current =
             (unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>
              *)std::
                vector<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>
                ::end(local_18);
        local_38 = __gnu_cxx::
                   __normal_iterator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_*,_std::vector<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>_>
                   ::operator-(&local_40,1);
        puVar6 = __gnu_cxx::
                 __normal_iterator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_*,_std::vector<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>_>
                 ::operator*(&local_38);
        this_01 = ::cm::
                  static_reference_cast<TextContent,_std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_0>
                            (puVar6);
        pcVar5 = __gnu_cxx::
                 __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
                 ::operator->(&this->it);
        TextContent::Extend(this_01,pcVar5->Length);
        n._M_t.super___uniq_ptr_impl<TextContent,_std::default_delete<TextContent>_>._M_t.
        super__Tuple_impl<0UL,_TextContent_*,_std::default_delete<TextContent>_>.
        super__Head_base<0UL,_TextContent_*,_false>._M_head_impl =
             (__uniq_ptr_data<TextContent,_std::default_delete<TextContent>,_true,_true>)
             std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>::
             end(&this->Tokens);
        bVar2 = __gnu_cxx::operator!=
                          (&this->it,
                           (__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
                            *)&n);
        if (bVar2) {
          __gnu_cxx::
          __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
          ::operator++(&this->it);
          return;
        }
        __assert_fail("this->it != this->Tokens.end()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmGeneratorExpressionParser.cxx"
                      ,0xda,
                      "void cmGeneratorExpressionParser::ParseContent(cmGeneratorExpressionEvaluatorVector &)"
                     );
      }
    }
    pcVar5 = __gnu_cxx::
             __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
             ::operator->(&this->it);
    __gnu_cxx::
    __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
    ::operator->(&this->it);
    std::make_unique<TextContent,char_const*const&,unsigned_long_const&>
              ((char **)&local_50,(unsigned_long *)&pcVar5->Content);
    this_00 = local_18;
    std::
    unique_ptr<cmGeneratorExpressionEvaluator,std::default_delete<cmGeneratorExpressionEvaluator>>::
    unique_ptr<TextContent,std::default_delete<TextContent>,void>
              ((unique_ptr<cmGeneratorExpressionEvaluator,std::default_delete<cmGeneratorExpressionEvaluator>>
                *)&local_58,&local_50);
    std::
    vector<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>
    ::push_back(this_00,(value_type *)&local_58);
    std::
    unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>
    ::~unique_ptr(&local_58);
    local_70[0]._M_current =
         (cmGeneratorExpressionToken *)
         std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>::end
                   (&this->Tokens);
    bVar2 = __gnu_cxx::operator!=(&this->it,local_70);
    if (!bVar2) {
      __assert_fail("this->it != this->Tokens.end()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmGeneratorExpressionParser.cxx"
                    ,0xe2,
                    "void cmGeneratorExpressionParser::ParseContent(cmGeneratorExpressionEvaluatorVector &)"
                   );
    }
    __gnu_cxx::
    __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
    ::operator++(&this->it);
    std::unique_ptr<TextContent,_std::default_delete<TextContent>_>::~unique_ptr(&local_50);
  }
  else if (uVar1 == 1) {
    local_78._M_current =
         (cmGeneratorExpressionToken *)
         std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>::end
                   (&this->Tokens);
    bVar2 = __gnu_cxx::operator!=(&this->it,&local_78);
    if (!bVar2) {
      __assert_fail("this->it != this->Tokens.end()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmGeneratorExpressionParser.cxx"
                    ,0xe7,
                    "void cmGeneratorExpressionParser::ParseContent(cmGeneratorExpressionEvaluatorVector &)"
                   );
    }
    __gnu_cxx::
    __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
    ::operator++(&this->it);
    ParseGeneratorExpression(this,local_18);
  }
  else {
    if (2 < uVar1 - 2) {
      __assert_fail("false && \"Unhandled token in generator expression.\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmGeneratorExpressionParser.cxx"
                    ,0xf7,
                    "void cmGeneratorExpressionParser::ParseContent(cmGeneratorExpressionEvaluatorVector &)"
                   );
    }
    if (this->NestingLevel != 0) {
      __assert_fail("false && \"Got unexpected syntax token.\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmGeneratorExpressionParser.cxx"
                    ,0xf1,
                    "void cmGeneratorExpressionParser::ParseContent(cmGeneratorExpressionEvaluatorVector &)"
                   );
    }
    local_80 = (this->it)._M_current;
    extendText(local_18,(const_iterator)local_80);
    local_88._M_current =
         (cmGeneratorExpressionToken *)
         std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>::end
                   (&this->Tokens);
    bVar2 = __gnu_cxx::operator!=(&this->it,&local_88);
    if (!bVar2) {
      __assert_fail("this->it != this->Tokens.end()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmGeneratorExpressionParser.cxx"
                    ,0xf3,
                    "void cmGeneratorExpressionParser::ParseContent(cmGeneratorExpressionEvaluatorVector &)"
                   );
    }
    __gnu_cxx::
    __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
    ::operator++(&this->it);
  }
  return;
}

Assistant:

void cmGeneratorExpressionParser::ParseContent(
  cmGeneratorExpressionEvaluatorVector& result)
{
  assert(this->it != this->Tokens.end());
  switch (this->it->TokenType) {
    case cmGeneratorExpressionToken::Text: {
      if (this->NestingLevel == 0) {
        if (!result.empty() &&
            (*(result.end() - 1))->GetType() ==
              cmGeneratorExpressionEvaluator::Text) {
          // A comma in 'plain text' could have split text that should
          // otherwise be continuous. Extend the last text content instead of
          // creating a new one.
          cm::static_reference_cast<TextContent>(*(result.end() - 1))
            .Extend(this->it->Length);
          assert(this->it != this->Tokens.end());
          ++this->it;
          return;
        }
      }
      auto n =
        cm::make_unique<TextContent>(this->it->Content, this->it->Length);
      result.push_back(std::move(n));
      assert(this->it != this->Tokens.end());
      ++this->it;
      return;
    }
    case cmGeneratorExpressionToken::BeginExpression:
      assert(this->it != this->Tokens.end());
      ++this->it;
      this->ParseGeneratorExpression(result);
      return;
    case cmGeneratorExpressionToken::EndExpression:
    case cmGeneratorExpressionToken::ColonSeparator:
    case cmGeneratorExpressionToken::CommaSeparator:
      if (this->NestingLevel == 0) {
        extendText(result, this->it);
      } else {
        assert(false && "Got unexpected syntax token.");
      }
      assert(this->it != this->Tokens.end());
      ++this->it;
      return;
  }
  assert(false && "Unhandled token in generator expression.");
}